

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Gia_Man_t *
Gia_ManCheckFalseAll(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  bool bVar3;
  int Changed0;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int Changed;
  int Tried;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nTimeOut_local;
  int nSlackMax_local;
  Gia_Man_t *p_local;
  
  pNew._4_4_ = 0;
  pNew._0_4_ = 0;
  _nTimeOut_local = Gia_ManDup(p);
  do {
    uVar1 = (uint)pNew;
    Gia_ManLevelNum(_nTimeOut_local);
    Changed0 = 0;
    while( true ) {
      bVar3 = false;
      if (Changed0 < _nTimeOut_local->nObjs) {
        _LevelMax = Gia_ManObj(_nTimeOut_local,Changed0);
        bVar3 = _LevelMax != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar2 = Gia_ObjIsAnd(_LevelMax);
      if ((iVar2 != 0) && (iVar2 = Gia_ObjLevel(_nTimeOut_local,_LevelMax), iVar2 <= nSlackMax)) {
        pNew._4_4_ = pNew._4_4_ + 1;
        p_00 = Gia_ManCheckOne(_nTimeOut_local,-1,Changed0,nTimeOut,fVerbose,fVeryVerbose);
        if (p_00 != (Gia_Man_t *)0x0) {
          pNew._0_4_ = (uint)pNew + 1;
          Gia_ManStop(_nTimeOut_local);
          Gia_ManLevelNum(p_00);
          _nTimeOut_local = p_00;
        }
      }
      Changed0 = Changed0 + 1;
    }
  } while (uVar1 != (uint)pNew);
  printf("Performed %d attempts and %d changes.\n",(ulong)pNew._4_4_,(ulong)(uint)pNew);
  return _nTimeOut_local;
}

Assistant:

Gia_Man_t * Gia_ManCheckFalseAll( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    p = Gia_ManDup( p );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( Gia_ObjLevel(p, pObj) > nSlackMax )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, -1, i, nTimeOut, fVerbose, fVeryVerbose );
            if ( pNew == NULL )
                continue;
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    return p;
}